

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackTarCompressGenerator.cxx
# Opt level: O2

void __thiscall
cmCPackTarCompressGenerator::cmCPackTarCompressGenerator(cmCPackTarCompressGenerator *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"paxr",&local_31);
  cmCPackArchiveGenerator::cmCPackArchiveGenerator
            (&this->super_cmCPackArchiveGenerator,CompressCompress,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCPackTarCompressGenerator_005bbee8;
  return;
}

Assistant:

cmCPackTarCompressGenerator::cmCPackTarCompressGenerator()
  :cmCPackArchiveGenerator(cmArchiveWrite::CompressCompress,
                           "paxr")
{
}